

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float items_height;
  
  iVar3 = this->ItemsCount;
  if ((iVar3 != 0) && (pIVar4 = GImGui->CurrentWindow, pIVar4->SkipItems != true)) {
    switch(this->StepNo) {
    case 0:
      this->DisplayStart = 0;
      this->DisplayEnd = 1;
      this->StartPosY = (pIVar4->DC).CursorPos.y;
      this->StepNo = 1;
      return true;
    case 1:
      if (iVar3 == 1) goto LAB_0018f610;
      items_height = (pIVar4->DC).CursorPos.y - this->StartPosY;
      if (items_height <= 0.0) {
        __assert_fail("items_height > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.cpp"
                      ,0x8c3,"bool ImGuiListClipper::Step()");
      }
      Begin(this,iVar3 + -1,items_height);
      uVar1 = this->DisplayStart;
      uVar2 = this->DisplayEnd;
      this->DisplayStart = uVar1 + 1;
      this->DisplayEnd = uVar2 + 1;
      break;
    case 2:
      if ((this->DisplayStart < 0) || (this->DisplayEnd < 0)) {
        __assert_fail("DisplayStart >= 0 && DisplayEnd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.cpp"
                      ,0x8cc,"bool ImGuiListClipper::Step()");
      }
      break;
    case 3:
      End(this);
    default:
      return false;
    }
    this->StepNo = 3;
    return true;
  }
LAB_0018f610:
  this->ItemsCount = -1;
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ItemsCount == 0 || window->SkipItems)
    {
        ItemsCount = -1;
        return false;
    }
    if (StepNo == 0) // Step 0: the clipper let you process the first element, regardless of it being visible or not, so we can measure the element height.
    {
        DisplayStart = 0;
        DisplayEnd = 1;
        StartPosY = window->DC.CursorPos.y;
        StepNo = 1;
        return true;
    }
    if (StepNo == 1) // Step 1: the clipper infer height from first element, calculate the actual range of elements to display, and position the cursor before the first element.
    {
        if (ItemsCount == 1) { ItemsCount = -1; return false; }
        float items_height = window->DC.CursorPos.y - StartPosY;
        IM_ASSERT(items_height > 0.0f);   // If this triggers, it means Item 0 hasn't moved the cursor vertically
        Begin(ItemsCount - 1, items_height);
        DisplayStart++;
        DisplayEnd++;
        StepNo = 3;
        return true;
    }
    if (StepNo == 2) // Step 2: dummy step only required if an explicit items_height was passed to constructor or Begin() and user still call Step(). Does nothing and switch to Step 3.
    {
        IM_ASSERT(DisplayStart >= 0 && DisplayEnd >= 0);
        StepNo = 3;
        return true;
    }
    if (StepNo == 3) // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd), advance the cursor to the end of the list and then returns 'false' to end the loop.
        End();
    return false;
}